

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O0

Error llvm::createStringError<unsigned_long,unsigned_char,unsigned_long>
                (error_code EC,char *Fmt,unsigned_long *Vals,uchar *Vals_1,unsigned_long *Vals_2)

{
  string *Args;
  llvm *this;
  unsigned_long *Vals_2_00;
  uchar *in_stack_00000008;
  format_object<unsigned_long,_unsigned_char,_unsigned_long> local_c0;
  undefined1 local_88 [8];
  raw_string_ostream Stream;
  string Buffer;
  uchar *Vals_local_1;
  unsigned_long *Vals_local;
  char *Fmt_local;
  error_code EC_local;
  
  this = EC._0_8_;
  Fmt_local._0_4_ = EC._M_cat._0_4_;
  Vals_2_00 = Vals_2;
  EC_local._0_8_ = Fmt;
  EC_local._M_cat = (error_category *)this;
  std::__cxx11::string::string((string *)&Stream.OS);
  raw_string_ostream::raw_string_ostream((raw_string_ostream *)local_88,(string *)&Stream.OS);
  format<unsigned_long,unsigned_char,unsigned_long>
            (&local_c0,(llvm *)Vals,(char *)Vals_1,Vals_2,in_stack_00000008,Vals_2_00);
  raw_ostream::operator<<((raw_ostream *)local_88,&local_c0.super_format_object_base);
  Args = raw_string_ostream::str_abi_cxx11_((raw_string_ostream *)local_88);
  make_error<llvm::StringError,std::__cxx11::string&,std::error_code&>
            (this,Args,(error_code *)&Fmt_local);
  raw_string_ostream::~raw_string_ostream((raw_string_ostream *)local_88);
  std::__cxx11::string::~string((string *)&Stream.OS);
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

inline Error createStringError(std::error_code EC, char const *Fmt,
                               const Ts &... Vals) {
  std::string Buffer;
  raw_string_ostream Stream(Buffer);
  Stream << format(Fmt, Vals...);
  return make_error<StringError>(Stream.str(), EC);
}